

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O0

int json_pointer_setf(json_object **obj,json_object *value,char *path_fmt,...)

{
  char in_AL;
  int *piVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [24];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_5c;
  undefined4 local_58;
  int rc;
  va_list args;
  json_object *set;
  char *path_copy;
  char *endp;
  char *path_fmt_local;
  json_object *value_local;
  json_object **obj_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  set = (json_object *)0x0;
  args[0].reg_save_area = (void *)0x0;
  local_5c = 0;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  endp = path_fmt;
  path_fmt_local = (char *)value;
  value_local = (json_object *)obj;
  if ((obj == (json_object **)0x0) || (path_fmt == (char *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    return -1;
  }
  args[0].overflow_arg_area = local_118;
  args[0]._0_8_ = &stack0x00000008;
  rc = 0x30;
  local_58 = 0x18;
  local_5c = vasprintf((char **)&set,path_fmt,&local_58);
  if (local_5c < 0) {
    return local_5c;
  }
  if ((char)set->o_type == json_type_null) {
    json_object_put(*(json_object **)value_local);
    *(char **)value_local = path_fmt_local;
  }
  else if ((char)set->o_type == 0x2f) {
    path_copy = strrchr((char *)set,0x2f);
    if ((json_object *)path_copy == set) {
      args[0].reg_save_area = *(void **)value_local;
    }
    else {
      *(undefined1 *)&((json_object *)path_copy)->o_type = json_type_null;
      local_5c = json_pointer_object_get_recursive
                           (*(json_object **)value_local,(char *)set,
                            (json_object **)&args[0].reg_save_area);
      if (local_5c != 0) goto LAB_0010f9ec;
      local_5c = 0;
    }
    path_copy = path_copy + 1;
    local_5c = json_pointer_set_single_path
                         ((json_object *)args[0].reg_save_area,path_copy,
                          (json_object *)path_fmt_local,json_object_array_put_idx_cb,(void *)0x0);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    local_5c = -1;
  }
LAB_0010f9ec:
  free(set);
  return local_5c;
}

Assistant:

int json_pointer_setf(struct json_object **obj, struct json_object *value, const char *path_fmt,
                      ...)
{
	char *endp;
	char *path_copy = NULL;
	struct json_object *set = NULL;
	va_list args;
	int rc = 0;

	if (!obj || !path_fmt)
	{
		errno = EINVAL;
		return -1;
	}

	/* pass a working copy to the recursive call */
	va_start(args, path_fmt);
	rc = vasprintf(&path_copy, path_fmt, args);
	va_end(args);

	if (rc < 0)
		return rc;

	if (path_copy[0] == '\0')
	{
		json_object_put(*obj);
		*obj = value;
		goto out;
	}

	if (path_copy[0] != '/')
	{
		errno = EINVAL;
		rc = -1;
		goto out;
	}

	/* If there's only 1 level to set, stop here */
	if ((endp = strrchr(path_copy, '/')) == path_copy)
	{
		set = *obj;
		goto set_single_path;
	}

	*endp = '\0';
	rc = json_pointer_object_get_recursive(*obj, path_copy, &set);

	if (rc)
		goto out;

set_single_path:
	endp++;
	rc = json_pointer_set_single_path(set, endp, value,
					  json_object_array_put_idx_cb, NULL);
out:
	free(path_copy);
	return rc;
}